

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O0

int __thiscall
FIX::Session::verify
          (Session *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  FieldMap *this_00;
  FieldBase *msgType;
  FieldBase *senderCompID_00;
  FieldBase *targetCompID_00;
  logic_error *this_01;
  long extraout_RAX;
  long extraout_RAX_00;
  long extraout_RAX_01;
  long lVar2;
  uint64_t uVar3;
  long extraout_RAX_02;
  unsigned_long value;
  unsigned_long value_00;
  ResendRange RVar4;
  MsgType local_1d8;
  UtcTimeStamp local_180 [3];
  exception *e;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  IntTConvertor<unsigned_long> *local_78;
  ResendRange range;
  SendingTime *sendingTime;
  TargetCompID *targetCompID;
  SenderCompID *senderCompID;
  Header *header;
  MsgSeqNum *pMsgSeqNum;
  MsgType *pMsgType;
  bool checkTooLow_local;
  bool checkTooHigh_local;
  Message *msg_local;
  Session *this_local;
  uint7 extraout_var;
  
  header = (Header *)0x0;
  this_00 = &Message::getHeader((Message *)ctx)->super_FieldMap;
  msgType = FieldMap::getFieldPtr(this_00,0x23);
  senderCompID_00 = FieldMap::getFieldRef(this_00,0x31);
  targetCompID_00 = FieldMap::getFieldRef(this_00,0x38);
  range.second = (unsigned_long)FieldMap::getFieldRef(this_00,0x34);
  if ((((ulong)sig & 1) != 0) || ((siglen & 1) != 0)) {
    header = (Header *)FieldMap::getFieldPtr(this_00,0x22);
  }
  bVar1 = validLogonState(this,(MsgType *)msgType);
  if (bVar1) {
    bVar1 = isGoodTime(this,(SendingTime *)range.second);
    if (bVar1) {
      bVar1 = isCorrectCompID(this,(SenderCompID *)senderCompID_00,(TargetCompID *)targetCompID_00);
      if (bVar1) {
        if ((((ulong)sig & 1) == 0) || (bVar1 = isTargetTooHigh(this,(MsgSeqNum *)header), !bVar1))
        {
          if (((siglen & 1) == 0) || (bVar1 = isTargetTooLow(this,(MsgSeqNum *)header), !bVar1)) {
            if (((((ulong)sig & 1) != 0) || ((siglen & 1) != 0)) &&
               (bVar1 = SessionState::resendRequested(&this->m_state), bVar1)) {
              RVar4 = SessionState::resendRange(&this->m_state);
              range.first = RVar4.second;
              local_78 = (IntTConvertor<unsigned_long> *)RVar4.first;
              uVar3 = UInt64Field::operator_cast_to_unsigned_long((UInt64Field *)header);
              if (range.first <= uVar3) {
                IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_118,local_78,value);
                std::operator+(&local_f8,"ResendRequest for messages FROM: ",&local_118);
                std::operator+(&local_d8,&local_f8," TO: ");
                IntTConvertor<unsigned_long>::convert_abi_cxx11_
                          ((string *)&e,(IntTConvertor<unsigned_long> *)range.first,value_00);
                std::operator+(&local_b8,&local_d8,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &e);
                std::operator+(&local_98,&local_b8," has been satisfied.");
                SessionState::onEvent(&this->m_state,&local_98);
                std::__cxx11::string::~string((string *)&local_98);
                std::__cxx11::string::~string((string *)&local_b8);
                std::__cxx11::string::~string((string *)&e);
                std::__cxx11::string::~string((string *)&local_d8);
                std::__cxx11::string::~string((string *)&local_f8);
                std::__cxx11::string::~string((string *)&local_118);
                SessionState::resendRange(&this->m_state,0,0);
              }
            }
            std::function<FIX::UtcTimeStamp_()>::operator()(local_180,&this->m_timestamper);
            SessionState::lastReceivedTime(&this->m_state,local_180);
            UtcTimeStamp::~UtcTimeStamp(local_180);
            SessionState::testRequest(&this->m_state,0);
            if (msgType == (FieldBase *)0x0) {
              MsgType::MsgType(&local_1d8);
            }
            else {
              MsgType::MsgType(&local_1d8,(MsgType *)msgType);
            }
            fromCallback(this,&local_1d8,(Message *)ctx,&this->m_sessionID);
            MsgType::~MsgType(&local_1d8);
            this_local._7_1_ = 1;
            lVar2 = extraout_RAX_02;
          }
          else {
            doTargetTooLow(this,(Message *)ctx);
            lVar2 = (ulong)extraout_var << 8;
            this_local._7_1_ = 0;
          }
        }
        else {
          doTargetTooHigh(this,(Message *)ctx);
          this_local._7_1_ = 0;
          lVar2 = extraout_RAX_01;
        }
      }
      else {
        doBadCompID(this,(Message *)ctx);
        this_local._7_1_ = 0;
        lVar2 = extraout_RAX_00;
      }
    }
    else {
      doBadTime(this,(Message *)ctx);
      this_local._7_1_ = 0;
      lVar2 = extraout_RAX;
    }
    return (int)CONCAT71((int7)((ulong)lVar2 >> 8),this_local._7_1_);
  }
  this_01 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_01,"Logon state is not valid for message");
  __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool Session::verify(const Message &msg, bool checkTooHigh, bool checkTooLow) {
  const MsgType *pMsgType = 0;
  const MsgSeqNum *pMsgSeqNum = 0;

  try {
    const Header &header = msg.getHeader();

    pMsgType = FIELD_GET_PTR(header, MsgType);
    const SenderCompID &senderCompID = FIELD_GET_REF(header, SenderCompID);
    const TargetCompID &targetCompID = FIELD_GET_REF(header, TargetCompID);
    const SendingTime &sendingTime = FIELD_GET_REF(header, SendingTime);

    if (checkTooHigh || checkTooLow) {
      pMsgSeqNum = FIELD_GET_PTR(header, MsgSeqNum);
    }

    if (!validLogonState(*pMsgType)) {
      throw std::logic_error("Logon state is not valid for message");
    }

    if (!isGoodTime(sendingTime)) {
      doBadTime(msg);
      return false;
    }
    if (!isCorrectCompID(senderCompID, targetCompID)) {
      doBadCompID(msg);
      return false;
    }

    if (checkTooHigh && isTargetTooHigh(*pMsgSeqNum)) {
      doTargetTooHigh(msg);
      return false;
    } else if (checkTooLow && isTargetTooLow(*pMsgSeqNum)) {
      doTargetTooLow(msg);
      return false;
    }

    if ((checkTooHigh || checkTooLow) && m_state.resendRequested()) {
      SessionState::ResendRange range = m_state.resendRange();

      if (*pMsgSeqNum >= range.second) {
        m_state.onEvent(
            "ResendRequest for messages FROM: " + SEQNUM_CONVERTOR::convert(range.first)
            + " TO: " + SEQNUM_CONVERTOR::convert(range.second) + " has been satisfied.");
        m_state.resendRange(0, 0);
      }
    }
  } catch (std::exception &e) {
    m_state.onEvent(e.what());
    disconnect();
    return false;
  }

  m_state.lastReceivedTime(m_timestamper());
  m_state.testRequest(0);

  fromCallback(pMsgType ? *pMsgType : MsgType(), msg, m_sessionID);
  return true;
}